

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

bool Js::JavascriptOperators::CanShortcutPrototypeChainOnUnknownPropertyName
               (RecyclableObject *prototype)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *pTVar4;
  
  if (prototype == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x15fc,"(prototype)","prototype");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pTVar4 = (prototype->type).ptr;
  bVar2 = true;
  while( true ) {
    if (pTVar4->typeId == TypeIds_Null) {
      return bVar2;
    }
    bVar2 = CanShortcutInstanceOnUnknownPropertyName(prototype);
    if (!bVar2) break;
    prototype = RecyclableObject::GetPrototype(prototype);
    pTVar4 = (prototype->type).ptr;
  }
  return bVar2;
}

Assistant:

bool JavascriptOperators::CanShortcutPrototypeChainOnUnknownPropertyName(RecyclableObject *prototype)
    {
        Assert(prototype);
        for (; !JavascriptOperators::IsNull(prototype); prototype = prototype->GetPrototype())
        {
            if (!CanShortcutInstanceOnUnknownPropertyName(prototype))
            {
                return false;
            }
        }
        return true;
    }